

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pragma_storage_info.cpp
# Opt level: O1

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> __thiscall
duckdb::PragmaStorageInfoBind
          (duckdb *this,ClientContext *context,TableFunctionBindInput *input,
          vector<duckdb::LogicalType,_true> *return_types,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
          *names)

{
  _Head_base<0UL,_duckdb::PragmaStorageFunctionData_*,_false> _Var1;
  _Alloc_hider _Var2;
  _Head_base<0UL,_duckdb::FunctionData_*,_false> _Var3;
  reference this_00;
  pointer pPVar4;
  templated_unique_single_t result;
  optional_ptr<duckdb::TableCatalogEntry,_true> entry;
  QualifiedName qname;
  _Head_base<0UL,_duckdb::PragmaStorageFunctionData_*,_false> local_e0;
  string local_d8;
  _Head_base<0UL,_duckdb::FunctionData_*,_false> local_b8;
  TableFunctionBindInput *local_b0;
  QualifiedName local_a8;
  vector<duckdb::ColumnSegmentInfo,_std::allocator<duckdb::ColumnSegmentInfo>_> local_48;
  
  local_b8._M_head_impl = (FunctionData *)this;
  local_b0 = input;
  ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[13]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)names,
             (char (*) [13])"row_group_id");
  ::std::vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>>::
  emplace_back<duckdb::LogicalTypeId_const&>
            ((vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>> *)return_types,
             &LogicalType::BIGINT);
  ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[12]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)names,
             (char (*) [12])"column_name");
  ::std::vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>>::
  emplace_back<duckdb::LogicalTypeId_const&>
            ((vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>> *)return_types,
             &LogicalType::VARCHAR);
  ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[10]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)names,
             (char (*) [10])"column_id");
  ::std::vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>>::
  emplace_back<duckdb::LogicalTypeId_const&>
            ((vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>> *)return_types,
             &LogicalType::BIGINT);
  ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[12]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)names,
             (char (*) [12])"column_path");
  ::std::vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>>::
  emplace_back<duckdb::LogicalTypeId_const&>
            ((vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>> *)return_types,
             &LogicalType::VARCHAR);
  ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[11]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)names,
             (char (*) [11])"segment_id");
  ::std::vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>>::
  emplace_back<duckdb::LogicalTypeId_const&>
            ((vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>> *)return_types,
             &LogicalType::BIGINT);
  ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[13]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)names,
             (char (*) [13])"segment_type");
  ::std::vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>>::
  emplace_back<duckdb::LogicalTypeId_const&>
            ((vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>> *)return_types,
             &LogicalType::VARCHAR);
  ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[6]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)names,
             (char (*) [6])0x1f988f9);
  ::std::vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>>::
  emplace_back<duckdb::LogicalTypeId_const&>
            ((vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>> *)return_types,
             &LogicalType::BIGINT);
  ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[6]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)names,
             (char (*) [6])0x1f15a6d);
  ::std::vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>>::
  emplace_back<duckdb::LogicalTypeId_const&>
            ((vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>> *)return_types,
             &LogicalType::BIGINT);
  ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[12]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)names,
             (char (*) [12])0x1e4b191);
  ::std::vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>>::
  emplace_back<duckdb::LogicalTypeId_const&>
            ((vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>> *)return_types,
             &LogicalType::VARCHAR);
  ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[6]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)names,
             (char (*) [6])0x1f1945e);
  ::std::vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>>::
  emplace_back<duckdb::LogicalTypeId_const&>
            ((vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>> *)return_types,
             &LogicalType::VARCHAR);
  ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[12]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)names,
             (char (*) [12])"has_updates");
  ::std::vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>>::
  emplace_back<duckdb::LogicalTypeId_const&>
            ((vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>> *)return_types,
             &LogicalType::BOOLEAN);
  ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[11]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)names,
             (char (*) [11])"persistent");
  ::std::vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>>::
  emplace_back<duckdb::LogicalTypeId_const&>
            ((vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>> *)return_types,
             &LogicalType::BOOLEAN);
  ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[9]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)names,
             (char (*) [9])"block_id");
  ::std::vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>>::
  emplace_back<duckdb::LogicalTypeId_const&>
            ((vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>> *)return_types,
             &LogicalType::BIGINT);
  ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[13]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)names,
             (char (*) [13])"block_offset");
  ::std::vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>>::
  emplace_back<duckdb::LogicalTypeId_const&>
            ((vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>> *)return_types,
             &LogicalType::BIGINT);
  ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[13]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)names,
             (char (*) [13])"segment_info");
  ::std::vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>>::
  emplace_back<duckdb::LogicalTypeId_const&>
            ((vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>> *)return_types,
             &LogicalType::VARCHAR);
  ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[21]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)names,
             (char (*) [21])"additional_block_ids");
  LogicalType::LogicalType((LogicalType *)&local_d8,BIGINT);
  LogicalType::LIST((LogicalType *)&local_a8,(LogicalType *)&local_d8);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::
  emplace_back<duckdb::LogicalType>
            (&return_types->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,
             (LogicalType *)&local_a8);
  LogicalType::~LogicalType((LogicalType *)&local_a8);
  LogicalType::~LogicalType((LogicalType *)&local_d8);
  this_00 = vector<duckdb::Value,_true>::operator[](local_b0->inputs,0);
  Value::GetValue<std::__cxx11::string>(&local_d8,this_00);
  QualifiedName::Parse(&local_a8,&local_d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p);
  }
  Binder::BindSchemaOrCatalog(context,&local_a8.catalog,&local_a8.schema);
  local_d8._M_dataplus._M_p =
       (pointer)Catalog::GetEntry<duckdb::TableCatalogEntry>
                          (context,&local_a8.catalog,&local_a8.schema,&local_a8.name,THROW_EXCEPTION
                           ,(QueryErrorContext)0xffffffffffffffff);
  optional_ptr<duckdb::TableCatalogEntry,_true>::CheckValid
            ((optional_ptr<duckdb::TableCatalogEntry,_true> *)&local_d8);
  _Var2._M_p = local_d8._M_dataplus._M_p;
  local_e0._M_head_impl = (PragmaStorageFunctionData *)operator_new(0x40);
  ((local_e0._M_head_impl)->super_TableFunctionData).column_ids.
  super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  *(pointer *)
   ((long)&((local_e0._M_head_impl)->super_TableFunctionData).column_ids.
           super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl + 8) =
       (pointer)0x0;
  *(pointer *)
   ((long)&((local_e0._M_head_impl)->super_TableFunctionData).column_ids.
           super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl + 0x10) =
       (pointer)0x0;
  ((local_e0._M_head_impl)->super_TableFunctionData).super_FunctionData._vptr_FunctionData =
       (_func_int **)&PTR__PragmaStorageFunctionData_02480288;
  (local_e0._M_head_impl)->table_entry = (TableCatalogEntry *)_Var2._M_p;
  ((local_e0._M_head_impl)->column_segments_info).
  super_vector<duckdb::ColumnSegmentInfo,_std::allocator<duckdb::ColumnSegmentInfo>_>.
  super__Vector_base<duckdb::ColumnSegmentInfo,_std::allocator<duckdb::ColumnSegmentInfo>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&((local_e0._M_head_impl)->column_segments_info).
           super_vector<duckdb::ColumnSegmentInfo,_std::allocator<duckdb::ColumnSegmentInfo>_>.
           super__Vector_base<duckdb::ColumnSegmentInfo,_std::allocator<duckdb::ColumnSegmentInfo>_>
           ._M_impl.super__Vector_impl_data + 8) = (pointer)0x0;
  *(pointer *)
   ((long)&((local_e0._M_head_impl)->column_segments_info).
           super_vector<duckdb::ColumnSegmentInfo,_std::allocator<duckdb::ColumnSegmentInfo>_>.
           super__Vector_base<duckdb::ColumnSegmentInfo,_std::allocator<duckdb::ColumnSegmentInfo>_>
           ._M_impl.super__Vector_impl_data + 0x10) = (pointer)0x0;
  (**(code **)(*(long *)_Var2._M_p + 0xb0))(&local_48,_Var2._M_p);
  pPVar4 = unique_ptr<duckdb::PragmaStorageFunctionData,_std::default_delete<duckdb::PragmaStorageFunctionData>,_true>
           ::operator->((unique_ptr<duckdb::PragmaStorageFunctionData,_std::default_delete<duckdb::PragmaStorageFunctionData>,_true>
                         *)&local_e0);
  local_d8._M_dataplus._M_p =
       (pointer)(pPVar4->column_segments_info).
                super_vector<duckdb::ColumnSegmentInfo,_std::allocator<duckdb::ColumnSegmentInfo>_>.
                super__Vector_base<duckdb::ColumnSegmentInfo,_std::allocator<duckdb::ColumnSegmentInfo>_>
                ._M_impl.super__Vector_impl_data._M_start;
  local_d8._M_string_length =
       (size_type)
       (pPVar4->column_segments_info).
       super_vector<duckdb::ColumnSegmentInfo,_std::allocator<duckdb::ColumnSegmentInfo>_>.
       super__Vector_base<duckdb::ColumnSegmentInfo,_std::allocator<duckdb::ColumnSegmentInfo>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  local_d8.field_2._M_allocated_capacity =
       (size_type)
       (pPVar4->column_segments_info).
       super_vector<duckdb::ColumnSegmentInfo,_std::allocator<duckdb::ColumnSegmentInfo>_>.
       super__Vector_base<duckdb::ColumnSegmentInfo,_std::allocator<duckdb::ColumnSegmentInfo>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  (pPVar4->column_segments_info).
  super_vector<duckdb::ColumnSegmentInfo,_std::allocator<duckdb::ColumnSegmentInfo>_>.
  super__Vector_base<duckdb::ColumnSegmentInfo,_std::allocator<duckdb::ColumnSegmentInfo>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_48.
       super__Vector_base<duckdb::ColumnSegmentInfo,_std::allocator<duckdb::ColumnSegmentInfo>_>.
       _M_impl.super__Vector_impl_data._M_start;
  (pPVar4->column_segments_info).
  super_vector<duckdb::ColumnSegmentInfo,_std::allocator<duckdb::ColumnSegmentInfo>_>.
  super__Vector_base<duckdb::ColumnSegmentInfo,_std::allocator<duckdb::ColumnSegmentInfo>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_48.
       super__Vector_base<duckdb::ColumnSegmentInfo,_std::allocator<duckdb::ColumnSegmentInfo>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  (pPVar4->column_segments_info).
  super_vector<duckdb::ColumnSegmentInfo,_std::allocator<duckdb::ColumnSegmentInfo>_>.
  super__Vector_base<duckdb::ColumnSegmentInfo,_std::allocator<duckdb::ColumnSegmentInfo>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_48.
       super__Vector_base<duckdb::ColumnSegmentInfo,_std::allocator<duckdb::ColumnSegmentInfo>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  local_48.super__Vector_base<duckdb::ColumnSegmentInfo,_std::allocator<duckdb::ColumnSegmentInfo>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.super__Vector_base<duckdb::ColumnSegmentInfo,_std::allocator<duckdb::ColumnSegmentInfo>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.super__Vector_base<duckdb::ColumnSegmentInfo,_std::allocator<duckdb::ColumnSegmentInfo>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ::std::vector<duckdb::ColumnSegmentInfo,_std::allocator<duckdb::ColumnSegmentInfo>_>::~vector
            ((vector<duckdb::ColumnSegmentInfo,_std::allocator<duckdb::ColumnSegmentInfo>_> *)
             &local_d8);
  ::std::vector<duckdb::ColumnSegmentInfo,_std::allocator<duckdb::ColumnSegmentInfo>_>::~vector
            (&local_48);
  _Var3._M_head_impl = local_b8._M_head_impl;
  _Var1._M_head_impl = local_e0._M_head_impl;
  local_e0._M_head_impl = (PragmaStorageFunctionData *)0x0;
  (local_b8._M_head_impl)->_vptr_FunctionData = (_func_int **)_Var1._M_head_impl;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8.name._M_dataplus._M_p != &local_a8.name.field_2) {
    operator_delete(local_a8.name._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8.schema._M_dataplus._M_p != &local_a8.schema.field_2) {
    operator_delete(local_a8.schema._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8.catalog._M_dataplus._M_p != &local_a8.catalog.field_2) {
    operator_delete(local_a8.catalog._M_dataplus._M_p);
  }
  return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
         (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
         _Var3._M_head_impl;
}

Assistant:

static unique_ptr<FunctionData> PragmaStorageInfoBind(ClientContext &context, TableFunctionBindInput &input,
                                                      vector<LogicalType> &return_types, vector<string> &names) {
	names.emplace_back("row_group_id");
	return_types.emplace_back(LogicalType::BIGINT);

	names.emplace_back("column_name");
	return_types.emplace_back(LogicalType::VARCHAR);

	names.emplace_back("column_id");
	return_types.emplace_back(LogicalType::BIGINT);

	names.emplace_back("column_path");
	return_types.emplace_back(LogicalType::VARCHAR);

	names.emplace_back("segment_id");
	return_types.emplace_back(LogicalType::BIGINT);

	names.emplace_back("segment_type");
	return_types.emplace_back(LogicalType::VARCHAR);

	names.emplace_back("start");
	return_types.emplace_back(LogicalType::BIGINT);

	names.emplace_back("count");
	return_types.emplace_back(LogicalType::BIGINT);

	names.emplace_back("compression");
	return_types.emplace_back(LogicalType::VARCHAR);

	names.emplace_back("stats");
	return_types.emplace_back(LogicalType::VARCHAR);

	names.emplace_back("has_updates");
	return_types.emplace_back(LogicalType::BOOLEAN);

	names.emplace_back("persistent");
	return_types.emplace_back(LogicalType::BOOLEAN);

	names.emplace_back("block_id");
	return_types.emplace_back(LogicalType::BIGINT);

	names.emplace_back("block_offset");
	return_types.emplace_back(LogicalType::BIGINT);

	names.emplace_back("segment_info");
	return_types.emplace_back(LogicalType::VARCHAR);

	names.emplace_back("additional_block_ids");
	return_types.emplace_back(LogicalType::LIST(LogicalTypeId::BIGINT));

	auto qname = QualifiedName::Parse(input.inputs[0].GetValue<string>());

	// look up the table name in the catalog
	Binder::BindSchemaOrCatalog(context, qname.catalog, qname.schema);
	auto &table_entry = Catalog::GetEntry<TableCatalogEntry>(context, qname.catalog, qname.schema, qname.name);
	auto result = make_uniq<PragmaStorageFunctionData>(table_entry);
	result->column_segments_info = table_entry.GetColumnSegmentInfo();
	return std::move(result);
}